

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcPrsOpBinGroup::parse(CTcPrsOpBinGroup *this)

{
  int iVar1;
  undefined4 extraout_var;
  CTcPrsNode *lhs;
  CTcPrsNode *local_18;
  
  iVar1 = (**this->left_->_vptr_CTcPrsOp)();
  local_18 = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  if (local_18 == (CTcPrsNode *)0x0) {
    local_18 = (CTcPrsNode *)0x0;
  }
  else {
    do {
      iVar1 = find_and_apply_op(this,&local_18);
    } while (iVar1 != 0);
  }
  return local_18;
}

Assistant:

CTcPrsNode *CTcPrsOpBinGroup::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find one of our operators */
    while (find_and_apply_op(&lhs)) ;

    /* return the expression tree */
    return lhs;
}